

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

PackageSymbol * __thiscall
slang::ast::Compilation::createPackage
          (Compilation *this,Scope *scope,ModuleDeclarationSyntax *syntax)

{
  templated_iterator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>_>
  tVar1;
  PackageSymbol *pPVar2;
  Diagnostic *this_00;
  pair<ska::detailv3::sherwood_v3_table<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>,_const_slang::syntax::ModuleDeclarationSyntax_*,_slang::Hasher<const_slang::syntax::ModuleDeclarationSyntax_*>,_ska::detailv3::KeyOrValueHasher<const_slang::syntax::ModuleDeclarationSyntax_*,_std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>,_slang::Hasher<const_slang::syntax::ModuleDeclarationSyntax_*>_>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_ska::detailv3::KeyOrValueEquality<const_slang::syntax::ModuleDeclarationSyntax_*,_std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>_>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>_>_>_>::templated_iterator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*,_slang::ast::Compilation::DefinitionMetadata>_>,_bool>
  pVar3;
  pair<ska::detailv3::sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>_>_>::templated_iterator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PackageSymbol_*>_>,_bool>
  pVar4;
  convertible_to_value local_29;
  PackageSymbol *local_28;
  
  local_28 = (PackageSymbol *)syntax;
  pVar3 = ska::detailv3::
          sherwood_v3_table<std::pair<slang::syntax::ModuleDeclarationSyntax_const*,slang::ast::Compilation::DefinitionMetadata>,slang::syntax::ModuleDeclarationSyntax_const*,slang::Hasher<slang::syntax::ModuleDeclarationSyntax_const*>,ska::detailv3::KeyOrValueHasher<slang::syntax::ModuleDeclarationSyntax_const*,std::pair<slang::syntax::ModuleDeclarationSyntax_const*,slang::ast::Compilation::DefinitionMetadata>,slang::Hasher<slang::syntax::ModuleDeclarationSyntax_const*>>,std::equal_to<slang::syntax::ModuleDeclarationSyntax_const*>,ska::detailv3::KeyOrValueEquality<slang::syntax::ModuleDeclarationSyntax_const*,std::pair<slang::syntax::ModuleDeclarationSyntax_const*,slang::ast::Compilation::DefinitionMetadata>,std::equal_to<slang::syntax::ModuleDeclarationSyntax_const*>>,std::allocator<std::pair<slang::syntax::ModuleDeclarationSyntax_const*,slang::ast::Compilation::DefinitionMetadata>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::ModuleDeclarationSyntax_const*,slang::ast::Compilation::DefinitionMetadata>>>>
          ::
          emplace<slang::syntax::ModuleDeclarationSyntax_const*,ska::flat_hash_map<slang::syntax::ModuleDeclarationSyntax_const*,slang::ast::Compilation::DefinitionMetadata,slang::Hasher<slang::syntax::ModuleDeclarationSyntax_const*>,std::equal_to<slang::syntax::ModuleDeclarationSyntax_const*>,std::allocator<std::pair<slang::syntax::ModuleDeclarationSyntax_const*,slang::ast::Compilation::DefinitionMetadata>>>::convertible_to_value>
                    ((sherwood_v3_table<std::pair<slang::syntax::ModuleDeclarationSyntax_const*,slang::ast::Compilation::DefinitionMetadata>,slang::syntax::ModuleDeclarationSyntax_const*,slang::Hasher<slang::syntax::ModuleDeclarationSyntax_const*>,ska::detailv3::KeyOrValueHasher<slang::syntax::ModuleDeclarationSyntax_const*,std::pair<slang::syntax::ModuleDeclarationSyntax_const*,slang::ast::Compilation::DefinitionMetadata>,slang::Hasher<slang::syntax::ModuleDeclarationSyntax_const*>>,std::equal_to<slang::syntax::ModuleDeclarationSyntax_const*>,ska::detailv3::KeyOrValueEquality<slang::syntax::ModuleDeclarationSyntax_const*,std::pair<slang::syntax::ModuleDeclarationSyntax_const*,slang::ast::Compilation::DefinitionMetadata>,std::equal_to<slang::syntax::ModuleDeclarationSyntax_const*>>,std::allocator<std::pair<slang::syntax::ModuleDeclarationSyntax_const*,slang::ast::Compilation::DefinitionMetadata>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::ModuleDeclarationSyntax_const*,slang::ast::Compilation::DefinitionMetadata>>>>
                      *)&this->definitionMetadata,(ModuleDeclarationSyntax **)&local_28,&local_29);
  tVar1 = pVar3.first.current;
  pPVar2 = PackageSymbol::fromSyntax
                     (scope,syntax,((tVar1.current)->field_1).value.second.defaultNetType,
                      (optional<slang::TimeScale>)
                      ((uint5)*(uint *)((long)&(tVar1.current)->field_1 + 0x1c) << 0x20 |
                      (uint5)*(uint *)((long)&(tVar1.current)->field_1 + 0x18)));
  local_28 = pPVar2;
  pVar4 = ska::detailv3::
          sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>>>>
          ::emplace<std::basic_string_view<char,std::char_traits<char>>&,slang::ast::PackageSymbol*>
                    ((sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PackageSymbol_const*>>>>
                      *)&this->packageMap,&(pPVar2->super_Symbol).name,&local_28);
  if ((((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
     ((pPVar2->super_Symbol).name._M_len != 0)) {
    this_00 = Scope::addDiag(scope,(DiagCode)0x24000a,(pPVar2->super_Symbol).location);
    Diagnostic::operator<<(this_00,(pPVar2->super_Symbol).name);
    Diagnostic::addNote(this_00,(DiagCode)0x80001,
                        ((((pVar4.first.current.current)->field_1).value.second)->super_Symbol).
                        location);
  }
  return pPVar2;
}

Assistant:

const PackageSymbol& Compilation::createPackage(const Scope& scope,
                                                const ModuleDeclarationSyntax& syntax) {
    auto& metadata = definitionMetadata[&syntax];
    auto& package = PackageSymbol::fromSyntax(scope, syntax, *metadata.defaultNetType,
                                              metadata.timeScale);

    auto [it, inserted] = packageMap.emplace(package.name, &package);
    if (!inserted && !package.name.empty()) {
        auto& diag = scope.addDiag(diag::Redefinition, package.location);
        diag << package.name;
        diag.addNote(diag::NotePreviousDefinition, it->second->location);
    }

    return package;
}